

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::TextureCubeGenMipmapCase::init
          (TextureCubeGenMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  NotSupportedError *this_00;
  TextureCube *this_01;
  int local_ec;
  string local_e8;
  int local_b4;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  TextureCubeGenMipmapCase *local_10;
  TextureCubeGenMipmapCase *this_local;
  
  local_10 = this;
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar1 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar1));
  if (SBORROW4(iVar1,this->m_size * 3) == iVar1 + this->m_size * -3 < 0) {
    iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar1 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar1));
    if (SBORROW4(iVar1,this->m_size * 2) == iVar1 + this->m_size * -2 < 0) {
      this_01 = (TextureCube *)operator_new(0x180);
      glu::TextureCube::TextureCube
                (this_01,this->m_renderCtx,this->m_format,this->m_dataType,this->m_size);
      this->m_texture = this_01;
      return (int)this;
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_b4 = this->m_size * 3;
  de::toString<int>(&local_b0,&local_b4);
  std::operator+(&local_90,"Render target size must be at least (",&local_b0);
  std::operator+(&local_70,&local_90,", ");
  local_ec = this->m_size * 2;
  de::toString<int>(&local_e8,&local_ec);
  std::operator+(&local_50,&local_70,&local_e8);
  std::operator+(&local_30,&local_50,")");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void TextureCubeGenMipmapCase::init (void)
{
	if (m_renderCtx.getRenderTarget().getWidth() < 3*m_size || m_renderCtx.getRenderTarget().getHeight() < 2*m_size)
		throw tcu::NotSupportedError("Render target size must be at least (" + de::toString(3*m_size) + ", " + de::toString(2*m_size) + ")");

	DE_ASSERT(!m_texture);
	m_texture = new TextureCube(m_renderCtx, m_format, m_dataType, m_size);
}